

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateConstructorAccess
          (ExpressionContext *ctx,SynBase *source,ArrayView<FunctionData_*> functions,
          ExprBase *context)

{
  FunctionData *pFVar1;
  TypeFunction *type;
  int iVar2;
  FunctionData **ppFVar3;
  undefined4 extraout_var;
  ExprFunctionAccess *this;
  TypeFunctionSet *pTVar4;
  undefined4 extraout_var_01;
  ulong uVar5;
  uint i;
  uint index;
  ArrayView<TypeBase_*> setTypes;
  ArrayView<FunctionData_*> functions_local;
  TypeFunction *local_e0;
  IntrusiveList<FunctionHandle> handles;
  SmallArray<TypeBase_*,_16U> types;
  FunctionHandle *node;
  undefined4 extraout_var_00;
  
  uVar5 = functions._8_8_;
  functions_local.data = functions.data;
  functions_local.count = functions.count;
  if (functions_local.count < 2) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_00,iVar2);
    ppFVar3 = ArrayView<FunctionData_*>::operator[](&functions_local,0);
    type = (*ppFVar3)->type;
    ppFVar3 = ArrayView<FunctionData_*>::operator[](&functions_local,0);
    ExprFunctionAccess::ExprFunctionAccess(this,source,&type->super_TypeBase,*ppFVar3,context);
  }
  else {
    types.allocator = ctx->allocator;
    types.data = types.little;
    types.count = 0;
    types.max = 0x10;
    handles.head = (FunctionHandle *)0x0;
    handles.tail = (FunctionHandle *)0x0;
    for (index = 0; index < (uint)uVar5; index = index + 1) {
      ppFVar3 = ArrayView<FunctionData_*>::operator[](&functions_local,index);
      pFVar1 = *ppFVar3;
      local_e0 = pFVar1->type;
      SmallArray<TypeBase_*,_16U>::push_back(&types,(TypeBase **)&local_e0);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      node = (FunctionHandle *)CONCAT44(extraout_var,iVar2);
      node->function = pFVar1;
      node->next = (FunctionHandle *)0x0;
      node->listed = false;
      IntrusiveList<FunctionHandle>::push_back(&handles,node);
      uVar5 = (ulong)functions_local.count;
    }
    setTypes.count = types.count;
    setTypes.data = types.data;
    setTypes._12_4_ = 0;
    pTVar4 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_01,iVar2);
    (this->super_ExprBase).typeID = 0x27;
    (this->super_ExprBase).source = source;
    (this->super_ExprBase).type = &pTVar4->super_TypeBase;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3980;
    this->function = (FunctionData *)handles.head;
    this->context = (ExprBase *)handles.tail;
    this[1].super_ExprBase._vptr_ExprBase = (_func_int **)context;
    SmallArray<TypeBase_*,_16U>::~SmallArray(&types);
  }
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateConstructorAccess(ExpressionContext &ctx, SynBase *source, ArrayView<FunctionData*> functions, ExprBase *context)
{
	if(functions.size() > 1)
	{
		SmallArray<TypeBase*, 16> types(ctx.allocator);
		IntrusiveList<FunctionHandle> handles;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			FunctionData *curr = functions[i];

			types.push_back(curr->type);
			handles.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(curr));
		}

		TypeFunctionSet *type = ctx.GetFunctionSetType(types);

		return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, handles, context);
	}

	return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, functions[0]->type, functions[0], context);
}